

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei)

{
  deUint32 unit;
  mapped_type *pmVar1;
  char *fragShaderSource_;
  char *pcVar2;
  Vector<float,_4> local_9e8;
  Vector<float,_4> local_9d8;
  TextureSpec local_9c8;
  string local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  VarSpec local_938;
  Vector<float,_2> local_890;
  Vector<float,_2> local_888;
  string local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  VarSpec local_840;
  deUint32 local_798;
  int i_1;
  Vector<float,_3> local_788;
  allocator<char> local_779;
  string local_778;
  VarSpec local_758;
  allocator<char> local_6a9;
  string local_6a8;
  string local_688;
  allocator<char> local_661;
  string local_660;
  string local_640;
  undefined1 local_61a;
  allocator<char> local_619;
  key_type local_618;
  string local_5f8;
  allocator<char> local_5d1;
  key_type local_5d0;
  allocator<char> local_5a9;
  key_type local_5a8;
  string local_588;
  allocator<char> local_561;
  key_type local_560;
  allocator<char> local_539;
  key_type local_538;
  string local_518;
  allocator<char> local_4f1;
  key_type local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  int local_11c;
  undefined1 local_118 [4];
  int i;
  string fragColorExpression;
  string fragSamplers;
  string fragTexCoordInputs;
  string vtxTexCoordWrites;
  string vtxTexCoordOutputs;
  string vtxTexCoordInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  int texHei_local;
  int texWid_local;
  int numTextures_local;
  ProgramLibrary *this_local;
  ProgramContext *context;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&vtxTexCoordInputs.field_2 + 8));
  std::__cxx11::string::string((string *)(vtxTexCoordOutputs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(vtxTexCoordWrites.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fragTexCoordInputs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fragSamplers.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fragColorExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_118);
  for (local_11c = 0; local_11c < numTextures; local_11c = local_11c + 1) {
    de::toString<int>(&local_180,&local_11c);
    std::operator+(&local_160,"${VTX_IN} mediump vec2 a_texCoord",&local_180);
    std::operator+(&local_140,&local_160,";\n");
    std::__cxx11::string::operator+=
              ((string *)(vtxTexCoordOutputs.field_2._M_local_buf + 8),(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    de::toString<int>(&local_1f0,&local_11c);
    std::operator+(&local_1d0,"${VTX_OUT} mediump vec2 v_texCoord",&local_1f0);
    std::operator+(&local_1b0,&local_1d0,";\n");
    std::__cxx11::string::operator+=
              ((string *)(vtxTexCoordWrites.field_2._M_local_buf + 8),(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    de::toString<int>(&local_2b0,&local_11c);
    std::operator+(&local_290,"\tv_texCoord",&local_2b0);
    std::operator+(&local_270,&local_290," = ");
    std::operator+(&local_250,&local_270,"a_texCoord");
    de::toString<int>(&local_2d0,&local_11c);
    std::operator+(&local_230,&local_250,&local_2d0);
    std::operator+(&local_210,&local_230,";\n");
    std::__cxx11::string::operator+=
              ((string *)(fragTexCoordInputs.field_2._M_local_buf + 8),(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    de::toString<int>(&local_330,&local_11c);
    std::operator+(&local_310,"${FRAG_IN} mediump vec2 v_texCoord",&local_330);
    std::operator+(&local_2f0,&local_310,";\n");
    std::__cxx11::string::operator+=
              ((string *)(fragSamplers.field_2._M_local_buf + 8),(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    de::toString<int>(&local_390,&local_11c);
    std::operator+(&local_370,"uniform mediump sampler2D u_sampler",&local_390);
    std::operator+(&local_350,&local_370,";\n");
    std::__cxx11::string::operator+=
              ((string *)(fragColorExpression.field_2._M_local_buf + 8),(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string((string *)&local_470);
    pcVar2 = "";
    if (0 < local_11c) {
      pcVar2 = " +";
    }
    std::operator+(&local_450,&local_470,pcVar2);
    std::operator+(&local_430,&local_450,"\n\t\t${TEXTURE_2D_FUNC}(u_sampler");
    de::toString<int>(&local_490,&local_11c);
    std::operator+(&local_410,&local_430,&local_490);
    std::operator+(&local_3f0,&local_410,", v_texCoord");
    de::toString<int>(&local_4b0,&local_11c);
    std::operator+(&local_3d0,&local_3f0,&local_4b0);
    std::operator+(&local_3b0,&local_3d0,")");
    std::__cxx11::string::operator+=((string *)local_118,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
  }
  substitute(&local_4d0,this,(string *)((long)&vtxTexCoordOutputs.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"VTX_TEX_COORD_INPUTS",&local_4f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_4f0);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4d0);
  substitute(&local_518,this,(string *)((long)&vtxTexCoordWrites.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"VTX_TEX_COORD_OUTPUTS",&local_539);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_538);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"VTX_TEX_COORD_WRITES",&local_561);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_560);
  std::__cxx11::string::operator=
            ((string *)pmVar1,(string *)(fragTexCoordInputs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  substitute(&local_588,this,(string *)((long)&fragSamplers.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"FRAG_TEX_COORD_INPUTS",&local_5a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_5a8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"FRAG_SAMPLERS",&local_5d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_5d0);
  std::__cxx11::string::operator=
            ((string *)pmVar1,(string *)(fragColorExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  substitute(&local_5f8,this,(string *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"FRAG_COLOR_EXPRESSION",&local_619);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxTexCoordInputs.field_2 + 8),&local_618);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(fragColorExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fragSamplers.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fragTexCoordInputs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(vtxTexCoordWrites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(vtxTexCoordOutputs.field_2._M_local_buf + 8));
  local_61a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_660,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_TEX_COORD_INPUTS}${VTX_TEX_COORD_OUTPUTS}\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n${VTX_TEX_COORD_WRITES}}\n"
             ,&local_661);
  substitute(&local_640,this,&local_660,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&vtxTexCoordInputs.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,
             "${FRAG_HEADER}${FRAG_TEX_COORD_INPUTS}${FRAG_SAMPLERS}\nvoid main (void)\n{\n\t${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n}\n"
             ,&local_6a9);
  substitute(&local_688,this,&local_6a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&vtxTexCoordInputs.field_2 + 8));
  fragShaderSource_ = (char *)std::__cxx11::string::c_str();
  gls::ProgramContext::ProgramContext(__return_storage_ptr__,pcVar2,fragShaderSource_,"a_position");
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"a_position",&local_779);
  tcu::Vector<float,_3>::Vector(&local_788,-0.1);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffff86c,0.1);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_758,&local_778,&local_788,(Vector<float,_3> *)&stack0xfffffffffffff86c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_758);
  VarSpec::~VarSpec(&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  for (local_798 = 0; (int)local_798 < numTextures; local_798 = local_798 + 1) {
    de::toString<int>(&local_880,(int *)&local_798);
    std::operator+(&local_860,"a_texCoord",&local_880);
    tcu::Vector<float,_2>::Vector(&local_888,0.0);
    tcu::Vector<float,_2>::Vector(&local_890,1.0);
    VarSpec::VarSpec<tcu::Vector<float,2>>(&local_840,&local_860,&local_888,&local_890);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->attributes,&local_840);
    VarSpec::~VarSpec(&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_880);
    de::toString<int>(&local_978,(int *)&local_798);
    std::operator+(&local_958,"u_sampler",&local_978);
    VarSpec::VarSpec<int>(&local_938,&local_958,(int *)&local_798);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_938);
    VarSpec::~VarSpec(&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    unit = local_798;
    tcu::Vector<float,_4>::Vector(&local_9d8,0.0);
    tcu::Vector<float,_4>::Vector(&local_9e8,1.0 / (float)numTextures);
    TextureSpec::TextureSpec
              (&local_9c8,TEXTURETYPE_2D,unit,texWid,texHei,0x1908,0x1401,0x1908,true,0x2703,0x2601,
               0x2901,0x2901,&local_9d8,&local_9e8);
    std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::push_back
              (&__return_storage_ptr__->textureSpecs,&local_9c8);
  }
  local_61a = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&vtxTexCoordInputs.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferAndTextureContext (const int numTextures, const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_TEX_COORD_INPUTS}"
		"${VTX_TEX_COORD_OUTPUTS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"${VTX_TEX_COORD_WRITES}"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_TEX_COORD_INPUTS}"
		"${FRAG_SAMPLERS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxTexCoordInputs;
		string vtxTexCoordOutputs;
		string vtxTexCoordWrites;
		string fragTexCoordInputs;
		string fragSamplers;
		string fragColorExpression;

		for (int i = 0; i < numTextures; i++)
		{
			vtxTexCoordInputs		+= "${VTX_IN} mediump vec2 a_texCoord" + toString(i) + ";\n";
			vtxTexCoordOutputs		+= "${VTX_OUT} mediump vec2 v_texCoord" + toString(i) + ";\n";
			vtxTexCoordWrites		+= "\tv_texCoord" + toString(i) + " = " + "a_texCoord" + toString(i) + ";\n";
			fragTexCoordInputs		+= "${FRAG_IN} mediump vec2 v_texCoord" + toString(i) + ";\n";
			fragSamplers			+= "uniform mediump sampler2D u_sampler" + toString(i) + ";\n";
			fragColorExpression		+= string() + (i > 0 ? " +" : "") + "\n\t\t${TEXTURE_2D_FUNC}(u_sampler" + toString(i) + ", v_texCoord" + toString(i) + ")";
		}

		firstLevelParams["VTX_TEX_COORD_INPUTS"]	= substitute(vtxTexCoordInputs);
		firstLevelParams["VTX_TEX_COORD_OUTPUTS"]	= substitute(vtxTexCoordOutputs);
		firstLevelParams["VTX_TEX_COORD_WRITES"]	= vtxTexCoordWrites;
		firstLevelParams["FRAG_TEX_COORD_INPUTS"]	= substitute(fragTexCoordInputs);
		firstLevelParams["FRAG_SAMPLERS"]			= fragSamplers;
		firstLevelParams["FRAG_COLOR_EXPRESSION"]	= substitute(fragColorExpression);
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate, firstLevelParams).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numTextures; i++)
	{
		context.attributes.push_back(gls::VarSpec("a_texCoord" + de::toString(i), Vec2(0.0f), Vec2(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_sampler" + de::toString(i), i));
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, i,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f / (float)numTextures)));
	}

	return context;
}